

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

bool __thiscall cmCTestBZR::UpdateParser::ProcessLine(UpdateParser *this)

{
  char c0;
  char c1;
  char c2;
  bool bVar1;
  char *pcVar2;
  string local_a0;
  string local_80;
  string local_60;
  string local_30;
  UpdateParser *local_10;
  UpdateParser *this_local;
  
  local_10 = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexUpdate,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexUpdate,1);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_30);
    c0 = *pcVar2;
    cmsys::RegularExpression::match_abi_cxx11_(&local_60,&this->RegexUpdate,2);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_60);
    c1 = *pcVar2;
    cmsys::RegularExpression::match_abi_cxx11_(&local_80,&this->RegexUpdate,3);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_80);
    c2 = *pcVar2;
    cmsys::RegularExpression::match_abi_cxx11_(&local_a0,&this->RegexUpdate,4);
    DoPath(this,c0,c1,c2,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return true;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexUpdate.find(this->Line))
      {
      this->DoPath(this->RegexUpdate.match(1)[0],
                   this->RegexUpdate.match(2)[0],
                   this->RegexUpdate.match(3)[0],
                   this->RegexUpdate.match(4));
      }
    return true;
    }